

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unparser_traits.h
# Opt level: O0

StatusOr<int> __thiscall
google::protobuf::json_internal::UnparseProto3Type::GetInt32(UnparseProto3Type *this,Field f)

{
  bool bVar1;
  Field *pFVar2;
  ulong uVar3;
  string *psVar4;
  Message *this_00;
  Type *this_01;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar5;
  StatusOr<int> SVar6;
  AlphaNum local_c8;
  AlphaNum local_98;
  undefined1 local_68 [48];
  Status local_38;
  string_view local_30;
  int local_20 [2];
  int32_t x;
  Field f_local;
  
  _x = f;
  f_local = (Field)this;
  pFVar2 = ResolverPool::Field::proto(f);
  Field::default_value_abi_cxx11_(pFVar2);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    pFVar2 = ResolverPool::Field::proto(_x);
    psVar4 = Field::default_value_abi_cxx11_(pFVar2);
    local_30 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar4);
    bVar1 = absl::lts_20240722::SimpleAtoi<int>(local_30,local_20);
    if (bVar1) {
      absl::lts_20240722::StatusOr<int>::StatusOr<int,_0>((StatusOr<int> *)this,local_20);
      uVar5 = extraout_RDX_01;
    }
    else {
      absl::lts_20240722::AlphaNum::AlphaNum(&local_98,"bad default value in type.proto: ");
      this_00 = ResolverPool::Field::parent(_x);
      this_01 = ResolverPool::Message::proto(this_00);
      psVar4 = Type::name_abi_cxx11_(this_01);
      absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>(&local_c8,psVar4);
      absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_68,&local_98);
      local_68._32_16_ =
           std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_68);
      absl::lts_20240722::InternalError(&local_38,local_68._32_8_,local_68._40_8_);
      absl::lts_20240722::StatusOr<int>::StatusOr<absl::lts_20240722::Status,_0>
                ((StatusOr<int> *)this,&local_38);
      absl::lts_20240722::Status::~Status(&local_38);
      std::__cxx11::string::~string((string *)local_68);
      uVar5 = extraout_RDX_00;
    }
  }
  else {
    local_20[1] = 0;
    absl::lts_20240722::StatusOr<int>::StatusOr<int,_0>((StatusOr<int> *)this,local_20 + 1);
    uVar5 = extraout_RDX;
  }
  SVar6.super_StatusOrData<int>._8_8_ = uVar5;
  SVar6.super_StatusOrData<int>.field_0 = (anon_union_8_1_1246618d_for_StatusOrData<int>_1)this;
  return (StatusOr<int>)SVar6.super_StatusOrData<int>;
}

Assistant:

static absl::StatusOr<int32_t> GetInt32(Field f) {
    if (f->proto().default_value().empty()) {
      return 0;
    }
    int32_t x;
    if (!absl::SimpleAtoi(f->proto().default_value(), &x)) {
      return absl::InternalError(absl::StrCat(
          "bad default value in type.proto: ", f->parent().proto().name()));
    }
    return x;
  }